

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteSparseArrayIndexProperties<Js::JavascriptArrayIndexStaticEnumerator,Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,ArrayType *arr)

{
  ScriptContext *requestContext;
  uint32 data;
  bool bVar1;
  BOOL BVar2;
  Engine *this_00;
  undefined1 local_48 [8];
  JavascriptArrayIndexStaticEnumerator e;
  Var value;
  
  requestContext =
       (this->
       super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
       ).super_ScriptContextHolder.m_scriptContext;
  local_48 = (undefined1  [8])arr;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(arr);
  e.m_array._0_4_ = 0xffffffff;
  e.m_index = 0;
  e._12_4_ = 0;
  while( true ) {
    bVar1 = JavascriptArrayIndexStaticEnumerator::MoveNext
                      ((JavascriptArrayIndexStaticEnumerator *)local_48);
    data = (uint32)e.m_array;
    if (!bVar1) break;
    BVar2 = JavascriptOperators::GetOwnItem
                      ((RecyclableObject *)arr,(uint32)e.m_array,(Var *)&e.m_index,requestContext);
    if (BVar2 != 0) {
      Write(this,data);
      this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                ::GetEngine(&this->
                             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           );
      SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                (this_00,(void *)e._8_8_);
    }
  }
  Write(this,0xffffffff);
  return;
}

Assistant:

void WriteSparseArrayIndexProperties(typename IndexEnumerator::ArrayType* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            IndexEnumerator e(arr);
            Var value = nullptr;

            while (e.MoveNext())
            {
                uint32 i = e.GetIndex();
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    Write(i);
                    this->GetEngine()->Clone(value);
                }
            }

            Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }